

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void __thiscall
CPP::WriteInitialization::addStringInitializer
          (WriteInitialization *this,Item *item,DomPropertyMap *properties,QString *name,int column,
          QString *directive)

{
  DomString *str;
  bool translatable;
  DomProperty *pDVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = QHash<QString,_DomProperty_*>::value(properties,name);
  if (pDVar1 != (DomProperty *)0x0) {
    str = pDVar1->m_string;
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    toString((QString *)&local_58,str);
    if (local_58.size != 0) {
      translatable = needsTranslation<DomString>(str);
      local_78.size = -0x5555555555555556;
      local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_78.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_98.size = 0;
      autoTrCall((QString *)&local_78,this,str,(QString *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      addInitializer(item,name,column,(QString *)&local_78,directive,translatable);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::addStringInitializer(Item *item,
        const DomPropertyMap &properties, const QString &name, int column, const QString &directive) const
{
    if (const DomProperty *p = properties.value(name)) {
        DomString *str = p->elementString();
        QString text = toString(str);
        if (!text.isEmpty()) {
            bool translatable = needsTranslation(str);
            QString value = autoTrCall(str);
            addInitializer(item, name, column, value, directive, translatable);
        }
    }
}